

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
ParserTest_temp_parser_Test::~ParserTest_temp_parser_Test(ParserTest_temp_parser_Test *this)

{
  ParserTest_temp_parser_Test *this_local;
  
  ~ParserTest_temp_parser_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(ParserTest, temp_parser) {
	EXPECT_THROW(serialize_object(u8"test_data", "test_tmp"), format_not_available);
	EXPECT_THROW(deserialize_object(u8"test_data"sv, "test_tmp"), format_not_available);

	{
		parser_registration<test_parser> test_tmp_registration{ "test_tmp" };
		EXPECT_NO_THROW(serialize_object(u8"test_data", "test_tmp"));
		EXPECT_NO_THROW(deserialize_object(u8"test_data"sv, "test_tmp"));
	}

	EXPECT_THROW(serialize_object(u8"test_data", "test_tmp"), format_not_available);
	EXPECT_THROW(deserialize_object(u8"test_data"sv, "test_tmp"), format_not_available);
}